

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall
moira::Moira::computeEAfull<(moira::Core)2,(moira::Mode)10,4,128ull>(Moira *this,u32 an)

{
  ushort ext_00;
  int iVar1;
  u32 uVar2;
  u32 local_4c;
  int ow;
  int dw;
  u32 od;
  u32 bd;
  u32 xn;
  u16 iis;
  u16 is;
  u16 bs;
  u16 scale;
  u16 lw;
  u16 rn;
  u16 ext;
  u32 result;
  u32 an_local;
  Moira *this_local;
  
  ext_00 = (this->queue).irc;
  od = 0;
  dw = 0;
  ow = 0;
  readExt<(moira::Core)2>(this);
  iVar1 = baseDispWords(this,ext_00);
  if (iVar1 == 1) {
    uVar2 = readExt<(moira::Core)2,2>(this);
    dw = SEXT<2>((ulong)uVar2);
  }
  if (iVar1 == 2) {
    dw = readExt<(moira::Core)2,4>(this);
  }
  iVar1 = outerDispWords(this,ext_00);
  if (iVar1 == 1) {
    uVar2 = readExt<(moira::Core)2,2>(this);
    ow = SEXT<2>((ulong)uVar2);
  }
  if (iVar1 == 2) {
    ow = readExt<(moira::Core)2,4>(this);
  }
  _rn = an;
  if (((int)(uint)ext_00 >> 7 & 1U) != 0) {
    _rn = 0;
  }
  if (((int)(uint)ext_00 >> 6 & 1U) == 0) {
    if (((int)(uint)ext_00 >> 0xb & 1U) == 0) {
      uVar2 = readR<4>(this,(int)(uint)ext_00 >> 0xc);
      local_4c = SEXT<2>((ulong)uVar2);
    }
    else {
      local_4c = readR<4>(this,(int)(uint)ext_00 >> 0xc);
    }
    od = local_4c << ((byte)((int)(uint)ext_00 >> 9) & 3);
  }
  if ((ext_00 & 4) == 0) {
    if ((ext_00 & 3) == 0) {
      _scale = _rn + dw + od;
    }
    else {
      _scale = readM<(moira::Core)2,(moira::Mode)10,4,0ull>(this,_rn + dw + od);
      _scale = _scale + ow;
    }
  }
  else {
    uVar2 = readM<(moira::Core)2,(moira::Mode)10,4,0ull>(this,_rn + dw);
    _scale = uVar2 + od + ow;
  }
  iVar1 = penaltyCycles<(moira::Core)2,(moira::Mode)10,4>(this,ext_00);
  this->cp = iVar1 + this->cp;
  return _scale;
}

Assistant:

u32
Moira::computeEAfull(u32 an)
{
    u32 result;

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
    // -----------------------------------------------------------------------

    u16  ext   = queue.irc;
    u16  rn    = xxxx____________ (ext);
    u16  lw    = ____x___________ (ext);
    u16  scale = _____xx_________ (ext);
    u16  bs    = ________x_______ (ext);
    u16  is    = _________x______ (ext);
    u16  iis   = _____________xxx (ext);

    u32 xn = 0, bd = 0, od = 0;

    // Read extension words
    readExt<C>();
    auto dw = baseDispWords(ext);
    if (dw == 1) bd = SEXT<Word>(readExt<C, Word>());
    if (dw == 2) bd = readExt<C, Long>();
    auto ow = outerDispWords(ext);
    if (ow == 1) od = SEXT<Word>(readExt<C, Word>());
    if (ow == 2) od = readExt<C, Long>();

    // Wipe out an if base register is present
    if (bs) an = 0;

    // Check if index is present
    if (!is) xn = (lw ? readR(rn) : SEXT<Word>(readR(rn))) << scale;

    // Compute effective address
    if (iis & 0b100) {
        result = readM<C, M, Long>(an + bd) + xn + od;
    } else if (iis & 0b011) {
        result = readM<C, M, Long>(an + bd + xn) + od;
    } else {
        result = an + bd + xn;
    }

    // Add the number of extra cycles consumed in this addressing mode
    cp += penaltyCycles<C, M, S>(ext);

    return result;
}